

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

bool __thiscall cfd::core::Script::IsWitnessProgram(Script *this)

{
  ScriptType SVar1;
  pointer pSVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  ByteData local_28;
  
  sVar3 = ByteData::GetDataSize(&this->script_data_);
  if ((((3 < sVar3) && (sVar3 = ByteData::GetDataSize(&this->script_data_), sVar3 < 0x2b)) &&
      (pSVar2 = (this->script_stack_).
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_start,
      (long)(this->script_stack_).
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 == 0xc0)) &&
     (((pSVar2->type_ == kElementOpCode && (pSVar2[1].type_ == kElementBinary)) &&
      (SVar1 = (pSVar2->op_code_).data_type_, SVar1 == kOpFalse || 0xffffffef < SVar1 - kOpNop)))) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_28.data_,&pSVar2[1].binary_data_.data_);
    sVar3 = ByteData::GetDataSize(&local_28);
    if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (SVar1 == kOpFalse) {
      bVar4 = sVar3 == 0x20;
      bVar5 = sVar3 == 0x14;
    }
    else {
      bVar4 = SVar1 != kOpTrue;
      bVar5 = sVar3 == 0x20;
    }
    return (bool)(bVar5 | bVar4);
  }
  return false;
}

Assistant:

bool Script::IsWitnessProgram() const {
  if ((script_data_.GetDataSize() < kMinWitnessProgramLength) ||
      (kMaxWitnessProgramLength < script_data_.GetDataSize()) ||
      (script_stack_.size() != 2) || (!script_stack_[0].IsOpCode()) ||
      (!script_stack_[1].IsBinary())) {
    return false;
  }
  auto op_code = script_stack_[0].GetOpCode().GetDataType();
  if ((op_code != ScriptType::kOp_0) &&
      ((op_code < ScriptType::kOp_1) || (op_code > ScriptType::kOp_16))) {
    return false;
  }

  auto hash_size = script_stack_[1].GetBinaryData().GetDataSize();
  if (op_code == ScriptType::kOp_0) {
    if ((hash_size != 0x14) && (hash_size != 0x20)) return false;
  } else if (op_code == ScriptType::kOp_1) {
    if (hash_size != 0x20) return false;
  }
  return true;
}